

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ModelDescription::MergeFrom(ModelDescription *this,ModelDescription *from)

{
  bool bVar1;
  LogMessage *other;
  long lVar2;
  string *psVar3;
  Metadata *this_00;
  Metadata *from_00;
  InternalMetadataWithArenaLite *this_01;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  ModelDescription *local_58;
  ModelDescription *from_local;
  ModelDescription *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/Model.pb.cc"
               ,0x97c);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_01 = &this->_internal_metadata_;
  this_local = (ModelDescription *)&local_58->_internal_metadata_;
  local_40 = this_01;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_01,&local_20->unknown_fields);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::MergeFrom
            (&this->input_,&local_58->input_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::MergeFrom
            (&this->output_,&local_58->output_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::MergeFrom
            (&this->traininginput_,&local_58->traininginput_);
  predictedfeaturename_abi_cxx11_(local_58);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->predictedfeaturename_,psVar3,(local_58->predictedfeaturename_).ptr_);
  }
  predictedprobabilitiesname_abi_cxx11_(local_58);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->predictedprobabilitiesname_,psVar3,
               (local_58->predictedprobabilitiesname_).ptr_);
  }
  bVar1 = has_metadata(local_58);
  if (bVar1) {
    this_00 = mutable_metadata(this);
    from_00 = metadata(local_58);
    Metadata::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void ModelDescription::MergeFrom(const ModelDescription& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ModelDescription)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  input_.MergeFrom(from.input_);
  output_.MergeFrom(from.output_);
  traininginput_.MergeFrom(from.traininginput_);
  if (from.predictedfeaturename().size() > 0) {

    predictedfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.predictedfeaturename_);
  }
  if (from.predictedprobabilitiesname().size() > 0) {

    predictedprobabilitiesname_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.predictedprobabilitiesname_);
  }
  if (from.has_metadata()) {
    mutable_metadata()->::CoreML::Specification::Metadata::MergeFrom(from.metadata());
  }
}